

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  BrotliEncoderDictionary *pBVar7;
  void *pvVar8;
  void *pvVar9;
  HasherCommon *pHVar10;
  uint8_t *puVar11;
  BrotliDictionary *pBVar12;
  int iVar13;
  uint16_t uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  ushort uVar23;
  int iVar24;
  uint32_t uVar25;
  uint uVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  BankH40 *banks_1;
  ulong *puVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ushort uVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  size_t sVar49;
  ulong uVar50;
  char cVar51;
  uint uVar52;
  BankH40 *banks;
  bool bVar53;
  ulong local_170;
  ulong local_168;
  ulong local_140;
  ulong local_120;
  ulong local_118;
  ulong local_108;
  int local_d8;
  uint local_d4;
  Command *local_d0;
  ulong local_c0;
  ulong local_b8;
  ulong local_a0;
  uint8_t *s1_orig_1;
  uint8_t *s1_orig;
  
  uVar15 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = (position - 3) + num_bytes;
  sVar27 = position;
  if (3 < num_bytes) {
    sVar27 = uVar3;
  }
  lVar28 = 0x200;
  if (params->quality < 9) {
    lVar28 = 0x40;
  }
  uVar1 = position + num_bytes;
  uVar4 = (position - 4) + num_bytes;
  sVar5 = params->stream_offset;
  uVar34 = *last_insert_len;
  uVar41 = lVar28 + position;
  sVar6 = (params->dictionary).compound.total_size;
  lVar16 = sVar6 + 1;
  local_d0 = commands;
LAB_0034ec3f:
LAB_0034ec4b:
  uVar31 = position;
  if (uVar1 <= uVar31 + 4) {
    *last_insert_len = (uVar34 + uVar1) - uVar31;
    *num_commands = *num_commands + ((long)local_d0 - (long)commands >> 4);
    return;
  }
  uVar36 = uVar15;
  if (uVar31 < uVar15) {
    uVar36 = uVar31;
  }
  uVar43 = sVar5 + uVar31;
  if (uVar15 <= sVar5 + uVar31) {
    uVar43 = uVar15;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_d4 = 0;
    local_a0 = 0;
    goto LAB_0034ecec;
  }
  if (uVar31 == 0) {
    local_a0 = 0;
LAB_0034ecc8:
    uVar22 = 0;
  }
  else {
    local_a0 = (ulong)ringbuffer[uVar31 - 1 & ringbuffer_mask];
    if (uVar31 == 1) goto LAB_0034ecc8;
    uVar22 = (ulong)ringbuffer[uVar31 - 2 & ringbuffer_mask];
  }
  local_d4 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar22 + 0x100] | literal_context_lut[local_a0]];
LAB_0034ecec:
  local_120 = uVar1 - uVar31;
  pBVar7 = (params->dictionary).contextual.dict[local_d4];
  uVar22 = (params->dist).max_distance;
  pvVar8 = (hasher->privat)._H40.extra[0];
  pvVar9 = (hasher->privat)._H40.extra[1];
  uVar38 = uVar31 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar38);
  uVar52 = (uint)(*(int *)(ringbuffer + uVar38) * 0x1e35a7bd) >> 0x11;
  uVar35 = 0x7e4;
  uVar17 = 0;
  uVar40 = 0;
  lVar48 = 0;
  local_170 = 0;
  do {
    cVar51 = (char)uVar52;
    if (lVar48 == 4) {
      uVar21 = (ulong)uVar52;
      sVar49 = (hasher->privat)._H5.block_size_;
      uVar47 = uVar31 - *(uint *)((long)pvVar8 + uVar21 * 4);
      uVar42 = *(ushort *)((long)pvVar8 + uVar21 * 2 + 0x20000);
      uVar39 = 0;
      uVar19 = uVar47;
      uVar29 = local_170;
      do {
        local_170 = uVar29;
        local_140 = uVar40;
        local_c0 = uVar35;
        uVar44 = uVar17;
        do {
          do {
            do {
              do {
                bVar53 = sVar49 == 0;
                sVar49 = sVar49 - 1;
                if ((bVar53) || (uVar39 = uVar39 + uVar19, uVar36 < uVar39)) {
                  uVar42 = (hasher->privat)._H42.free_slot_idx[0];
                  (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
                  if (0xfffe < uVar47) {
                    uVar47 = 0xffff;
                  }
                  *(char *)((long)pvVar8 + (uVar31 & 0xffff) + 0x30000) = cVar51;
                  *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar47;
                  *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
                       *(undefined2 *)((long)pvVar8 + uVar21 * 2 + 0x20000);
                  *(int *)((long)pvVar8 + uVar21 * 4) = (int)uVar31;
                  *(ushort *)((long)pvVar8 + uVar21 * 2 + 0x20000) = uVar42;
                  iVar24 = 0;
                  if (local_c0 != 0x7e4) goto LAB_0034f25c;
                  pHVar10 = (hasher->privat)._H5.common_;
                  uVar36 = pHVar10->dict_num_lookups;
                  local_170 = pHVar10->dict_num_matches;
                  if (local_170 < uVar36 >> 7) goto LAB_0034f269;
                  uVar17 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar11 = pBVar7->hash_table_lengths;
                  iVar24 = 0;
                  local_c0 = 0x7e4;
                  lVar48 = 0;
                  goto LAB_0034f088;
                }
                uVar17 = (ulong)uVar42;
                uVar42 = *(ushort *)((long)pvVar9 + uVar17 * 4 + 2);
                uVar19 = (ulong)*(ushort *)((long)pvVar9 + uVar17 * 4);
              } while (ringbuffer_mask < uVar38 + local_170);
              uVar35 = uVar31 - uVar39 & ringbuffer_mask;
              uVar17 = local_170 + uVar35;
            } while ((ringbuffer_mask < uVar17) ||
                    (ringbuffer[uVar38 + local_170] != ringbuffer[uVar17]));
            puVar20 = (ulong *)(ringbuffer + uVar35);
            lVar48 = 0;
            uVar17 = local_120;
            puVar33 = puVar2;
LAB_0034ef0b:
            if (uVar17 < 8) {
              for (uVar40 = 0;
                  (uVar17 != uVar40 &&
                  (*(char *)((long)puVar20 + uVar40) == *(char *)((long)puVar33 + uVar40)));
                  uVar40 = uVar40 + 1) {
              }
            }
            else {
              if (*puVar33 == *puVar20) goto code_r0x0034ef1c;
              uVar35 = *puVar20 ^ *puVar33;
              uVar17 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar40 = uVar17 >> 3 & 0x1fffffff;
            }
            uVar40 = uVar40 - lVar48;
          } while (uVar40 < 4);
          iVar24 = 0x1f;
          if ((uint)uVar39 != 0) {
            for (; (uint)uVar39 >> iVar24 == 0; iVar24 = iVar24 + -1) {
            }
          }
          uVar35 = (ulong)(iVar24 * -0x1e + 0x780) + uVar40 * 0x87;
          uVar17 = uVar39;
          uVar29 = uVar40;
        } while (uVar35 <= local_c0);
      } while( true );
    }
    uVar29 = (ulong)dist_cache[lVar48];
    uVar19 = uVar31 - uVar29;
    if ((((lVar48 == 0) || (*(char *)((long)pvVar8 + (uVar19 & 0xffff) + 0x30000) == cVar51)) &&
        (uVar29 <= uVar36)) && (uVar19 < uVar31)) {
      puVar20 = (ulong *)(ringbuffer + (uVar19 & ringbuffer_mask));
      lVar46 = 0;
      uVar19 = local_120;
      puVar33 = puVar2;
LAB_0034edaf:
      if (uVar19 < 8) {
        for (uVar39 = 0;
            (uVar19 != uVar39 &&
            (*(char *)((long)puVar20 + uVar39) == *(char *)((long)puVar33 + uVar39)));
            uVar39 = uVar39 + 1) {
        }
      }
      else {
        if (*puVar33 == *puVar20) goto code_r0x0034edc0;
        uVar39 = *puVar20 ^ *puVar33;
        uVar19 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        uVar39 = uVar19 >> 3 & 0x1fffffff;
      }
      uVar39 = uVar39 - lVar46;
      if ((1 < uVar39) && (uVar19 = uVar39 * 0x87 + 0x78f, uVar35 < uVar19)) {
        if (lVar48 != 0) {
          uVar19 = uVar19 - ((0x1ca10U >> ((byte)lVar48 & 2) & 4) + 0x27);
        }
        if (uVar35 < uVar19) {
          uVar17 = uVar29;
          uVar35 = uVar19;
          uVar40 = uVar39;
          local_170 = uVar39;
        }
      }
    }
    lVar48 = lVar48 + 1;
  } while( true );
LAB_0034f088:
  if (lVar48 == 2) goto LAB_0034f25c;
  uVar36 = uVar36 + 1;
  pHVar10->dict_num_lookups = uVar36;
  bVar18 = puVar11[uVar17];
  uVar35 = (ulong)bVar18;
  if ((uVar35 != 0) && (uVar35 <= local_120)) {
    pBVar12 = pBVar7->words;
    puVar20 = (ulong *)(pBVar12->data +
                       (ulong)pBVar12->offsets_by_length[uVar35] +
                       pBVar7->hash_table_words[uVar17] * uVar35);
    lVar46 = 0;
    puVar33 = puVar2;
    uVar40 = uVar35;
LAB_0034f0f2:
    if (uVar40 < 8) {
      for (uVar40 = 0;
          ((bVar18 & 7) != uVar40 &&
          (*(char *)((long)puVar33 + uVar40) == *(char *)((long)puVar20 + uVar40)));
          uVar40 = uVar40 + 1) {
      }
    }
    else {
      if (*puVar20 == *puVar33) goto code_r0x0034f104;
      uVar38 = *puVar33 ^ *puVar20;
      uVar40 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
    uVar40 = uVar40 - lVar46;
    if (((uVar40 != 0) && (uVar35 < pBVar7->cutoffTransformsCount + uVar40)) &&
       (uVar35 = (ulong)pBVar7->hash_table_words[uVar17] + uVar43 + lVar16 +
                 ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                ((char)(uVar35 - uVar40) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar35 - uVar40) * 4 << (pBVar12->size_bits_by_length[uVar35] & 0x3f)),
       uVar35 <= uVar22)) {
      iVar32 = 0x1f;
      if ((uint)uVar35 != 0) {
        for (; (uint)uVar35 >> iVar32 == 0; iVar32 = iVar32 + -1) {
        }
      }
      uVar38 = (uVar40 * 0x87 - (ulong)(uint)(iVar32 * 0x1e)) + 0x780;
      if (local_c0 <= uVar38) {
        iVar24 = (uint)bVar18 - (int)uVar40;
        local_170 = local_170 + 1;
        pHVar10->dict_num_matches = local_170;
        local_c0 = uVar38;
        uVar44 = uVar35;
        local_140 = uVar40;
      }
    }
  }
  lVar48 = lVar48 + 1;
  uVar17 = uVar17 + 1;
  goto LAB_0034f088;
LAB_0034f25c:
  if (local_c0 < 0x7e5) {
LAB_0034f269:
    uVar34 = uVar34 + 1;
    position = uVar31 + 1;
    if (uVar41 < position) {
      if ((uint)((int)lVar28 * 4) + uVar41 < position) {
        uVar36 = uVar31 + 0x11;
        if (uVar4 <= uVar31 + 0x11) {
          uVar36 = uVar4;
        }
        for (; position < uVar36; position = position + 4) {
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar9 = (hasher->privat)._H40.extra[1];
          uVar52 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar31 = (ulong)uVar52;
          uVar42 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
          uVar43 = position - *(uint *)((long)pvVar8 + uVar31 * 4);
          *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar52;
          if (0xfffe < uVar43) {
            uVar43 = 0xffff;
          }
          *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar43;
          *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
               *(undefined2 *)((long)pvVar8 + uVar31 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar31 * 4) = (int)position;
          *(ushort *)((long)pvVar8 + uVar31 * 2 + 0x20000) = uVar42;
          uVar34 = uVar34 + 4;
        }
      }
      else {
        uVar36 = uVar31 + 9;
        if (uVar3 <= uVar31 + 9) {
          uVar36 = uVar3;
        }
        for (; position < uVar36; position = position + 2) {
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar9 = (hasher->privat)._H40.extra[1];
          uVar52 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar31 = (ulong)uVar52;
          uVar42 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
          uVar43 = position - *(uint *)((long)pvVar8 + uVar31 * 4);
          *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar52;
          if (0xfffe < uVar43) {
            uVar43 = 0xffff;
          }
          *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar43;
          *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
               *(undefined2 *)((long)pvVar8 + uVar31 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar31 * 4) = (int)position;
          *(ushort *)((long)pvVar8 + uVar31 * 2 + 0x20000) = uVar42;
          uVar34 = uVar34 + 2;
        }
      }
    }
    goto LAB_0034ec4b;
  }
  local_d8 = 0;
  uVar41 = uVar34;
  uVar42 = (hasher->privat)._H42.free_slot_idx[0];
LAB_0034f3e8:
  local_120 = local_120 - 1;
  local_108 = local_140 - 1;
  if (local_120 <= local_140 - 1) {
    local_108 = local_120;
  }
  if (4 < params->quality) {
    local_108 = 0;
  }
  uVar36 = uVar31 + 1;
  uVar43 = uVar15;
  if (uVar36 < uVar15) {
    uVar43 = uVar36;
  }
  local_b8 = sVar5 + uVar31 + 1;
  if (uVar15 <= local_b8) {
    local_b8 = uVar15;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_d4 = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_a0 + 0x100] |
                      literal_context_lut[ringbuffer[uVar31 & ringbuffer_mask]]];
    local_a0 = (ulong)ringbuffer[uVar31 & ringbuffer_mask];
  }
  pBVar7 = (params->dictionary).contextual.dict[local_d4];
  uVar22 = (params->dist).max_distance;
  pvVar8 = (hasher->privat)._H40.extra[0];
  pvVar9 = (hasher->privat)._H40.extra[1];
  uVar38 = uVar36 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar38);
  uVar52 = (uint)(*(int *)(ringbuffer + uVar38) * 0x1e35a7bd) >> 0x11;
  uVar35 = 0x7e4;
  uVar17 = 0;
  uVar40 = 0;
  lVar48 = 0;
  do {
    cVar51 = (char)uVar52;
    if (lVar48 == 4) {
      uVar21 = (ulong)uVar52;
      sVar49 = (hasher->privat)._H5.block_size_;
      uVar47 = uVar36 - *(uint *)((long)pvVar8 + uVar21 * 4);
      uVar23 = *(ushort *)((long)pvVar8 + uVar21 * 2 + 0x20000);
      uVar39 = 0;
      uVar19 = uVar47;
      uVar29 = local_108;
      do {
        local_108 = uVar29;
        uVar50 = uVar40;
        local_168 = uVar35;
        uVar30 = uVar17;
        do {
          do {
            do {
              do {
                bVar53 = sVar49 == 0;
                sVar49 = sVar49 - 1;
                if ((bVar53) || (uVar39 = uVar39 + uVar19, uVar43 < uVar39)) {
                  (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
                  *(char *)((long)pvVar8 + (uVar36 & 0xffff) + 0x30000) = cVar51;
                  if (0xfffe < uVar47) {
                    uVar47 = 0xffff;
                  }
                  *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar47;
                  *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
                       *(undefined2 *)((long)pvVar8 + uVar21 * 2 + 0x20000);
                  *(int *)((long)pvVar8 + uVar21 * 4) = (int)uVar36;
                  *(ushort *)((long)pvVar8 + uVar21 * 2 + 0x20000) = uVar42;
                  iVar32 = 0;
                  if (local_168 != 0x7e4) goto LAB_0034f9f4;
                  pHVar10 = (hasher->privat)._H5.common_;
                  uVar43 = pHVar10->dict_num_lookups;
                  local_118 = pHVar10->dict_num_matches;
                  if (local_118 < uVar43 >> 7) {
                    local_168 = 0x7e4;
                    goto LAB_0034f9f4;
                  }
                  uVar17 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar11 = pBVar7->hash_table_lengths;
                  local_168 = 0x7e4;
                  iVar32 = 0;
                  lVar48 = 0;
                  goto LAB_0034f861;
                }
                uVar17 = (ulong)uVar23;
                uVar23 = *(ushort *)((long)pvVar9 + uVar17 * 4 + 2);
                uVar19 = (ulong)*(ushort *)((long)pvVar9 + uVar17 * 4);
              } while (ringbuffer_mask < uVar38 + local_108);
              uVar35 = uVar36 - uVar39 & ringbuffer_mask;
              uVar17 = local_108 + uVar35;
            } while ((ringbuffer_mask < uVar17) ||
                    (ringbuffer[uVar38 + local_108] != ringbuffer[uVar17]));
            puVar20 = (ulong *)(ringbuffer + uVar35);
            lVar48 = 0;
            puVar33 = puVar2;
            uVar17 = local_120;
LAB_0034f6a7:
            if (uVar17 < 8) {
              for (uVar40 = 0;
                  (uVar17 != uVar40 &&
                  (*(char *)((long)puVar20 + uVar40) == *(char *)((long)puVar33 + uVar40)));
                  uVar40 = uVar40 + 1) {
              }
            }
            else {
              if (*puVar33 == *puVar20) goto code_r0x0034f6b9;
              uVar35 = *puVar20 ^ *puVar33;
              uVar17 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar40 = uVar17 >> 3 & 0x1fffffff;
            }
            uVar40 = uVar40 - lVar48;
          } while (uVar40 < 4);
          iVar32 = 0x1f;
          if ((uint)uVar39 != 0) {
            for (; (uint)uVar39 >> iVar32 == 0; iVar32 = iVar32 + -1) {
            }
          }
          uVar35 = (ulong)(iVar32 * -0x1e + 0x780) + uVar40 * 0x87;
          uVar17 = uVar39;
          uVar29 = uVar40;
        } while (uVar35 <= local_168);
      } while( true );
    }
    uVar29 = (ulong)dist_cache[lVar48];
    uVar19 = uVar36 - uVar29;
    if ((((lVar48 == 0) || (*(char *)((long)pvVar8 + (uVar19 & 0xffff) + 0x30000) == cVar51)) &&
        (uVar29 <= uVar43)) && (uVar19 < uVar36)) {
      puVar20 = (ulong *)(ringbuffer + (uVar19 & ringbuffer_mask));
      lVar46 = 0;
      uVar19 = local_120;
      puVar33 = puVar2;
LAB_0034f540:
      if (uVar19 < 8) {
        for (uVar39 = 0;
            (uVar19 != uVar39 &&
            (*(char *)((long)puVar20 + uVar39) == *(char *)((long)puVar33 + uVar39)));
            uVar39 = uVar39 + 1) {
        }
      }
      else {
        if (*puVar33 == *puVar20) goto code_r0x0034f552;
        uVar39 = *puVar20 ^ *puVar33;
        uVar19 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        uVar39 = uVar19 >> 3 & 0x1fffffff;
      }
      uVar39 = uVar39 - lVar46;
      if ((1 < uVar39) && (uVar19 = uVar39 * 0x87 + 0x78f, uVar35 < uVar19)) {
        if (lVar48 != 0) {
          uVar19 = uVar19 - ((0x1ca10U >> ((byte)lVar48 & 2) & 4) + 0x27);
        }
        if (uVar35 < uVar19) {
          uVar17 = uVar29;
          uVar35 = uVar19;
          uVar40 = uVar39;
          local_108 = uVar39;
        }
      }
    }
    lVar48 = lVar48 + 1;
  } while( true );
LAB_0034f861:
  if (lVar48 == 2) goto LAB_0034f9f4;
  uVar43 = uVar43 + 1;
  pHVar10->dict_num_lookups = uVar43;
  bVar18 = puVar11[uVar17];
  uVar35 = (ulong)bVar18;
  if ((uVar35 != 0) && (uVar35 <= local_120)) {
    pBVar12 = pBVar7->words;
    puVar20 = (ulong *)(pBVar12->data +
                       (ulong)pBVar12->offsets_by_length[uVar35] +
                       pBVar7->hash_table_words[uVar17] * uVar35);
    lVar46 = 0;
    uVar40 = uVar35;
    puVar33 = puVar2;
LAB_0034f8d3:
    if (uVar40 < 8) {
      for (uVar40 = 0;
          ((bVar18 & 7) != uVar40 &&
          (*(char *)((long)puVar33 + uVar40) == *(char *)((long)puVar20 + uVar40)));
          uVar40 = uVar40 + 1) {
      }
    }
    else {
      if (*puVar20 == *puVar33) goto code_r0x0034f8e5;
      uVar38 = *puVar33 ^ *puVar20;
      uVar40 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
    uVar40 = uVar40 - lVar46;
    if (((uVar40 != 0) && (uVar35 < pBVar7->cutoffTransformsCount + uVar40)) &&
       (uVar35 = (ulong)pBVar7->hash_table_words[uVar17] + lVar16 + local_b8 +
                 ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                ((char)(uVar35 - uVar40) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar35 - uVar40) * 4 << (pBVar12->size_bits_by_length[uVar35] & 0x3f)),
       uVar35 <= uVar22)) {
      iVar13 = 0x1f;
      if ((uint)uVar35 != 0) {
        for (; (uint)uVar35 >> iVar13 == 0; iVar13 = iVar13 + -1) {
        }
      }
      uVar38 = (uVar40 * 0x87 - (ulong)(uint)(iVar13 * 0x1e)) + 0x780;
      if (local_168 <= uVar38) {
        iVar32 = (uint)bVar18 - (int)uVar40;
        local_118 = local_118 + 1;
        pHVar10->dict_num_matches = local_118;
        local_168 = uVar38;
        uVar30 = uVar35;
        uVar50 = uVar40;
      }
    }
  }
  lVar48 = lVar48 + 1;
  uVar17 = uVar17 + 1;
  goto LAB_0034f861;
code_r0x0034f8e5:
  puVar20 = puVar20 + 1;
  puVar33 = puVar33 + 1;
  uVar40 = uVar40 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_0034f8d3;
LAB_0034f9f4:
  if (local_168 < local_c0 + 0xaf) {
    uVar43 = uVar41;
    uVar30 = uVar44;
    uVar50 = local_140;
    uVar36 = uVar31;
    iVar32 = iVar24;
    local_b8 = uVar31 + sVar5;
    if (uVar15 <= uVar31 + sVar5) {
      local_b8 = uVar15;
    }
    goto LAB_0034fa98;
  }
  uVar43 = uVar34 + 4;
  if (local_d8 == 3) goto LAB_0034fa98;
  uVar43 = uVar41 + 1;
  local_d8 = local_d8 + 1;
  uVar22 = uVar31 + 5;
  local_c0 = local_168;
  local_140 = uVar50;
  uVar31 = uVar36;
  uVar41 = uVar43;
  uVar44 = uVar30;
  iVar24 = iVar32;
  uVar42 = uVar42 + 1;
  if (uVar1 <= uVar22) goto LAB_0034fa98;
  goto LAB_0034f3e8;
LAB_0034fa98:
  local_b8 = local_b8 + sVar6;
  if (local_b8 < uVar30) {
LAB_0034fab5:
    uVar41 = uVar30 + 0xf;
  }
  else {
    if (uVar30 == (long)*dist_cache) {
      uVar41 = 0;
      goto LAB_0034fae6;
    }
    uVar41 = 1;
    if (uVar30 != (long)dist_cache[1]) {
      uVar41 = (uVar30 + 3) - (long)*dist_cache;
      if (uVar41 < 7) {
        bVar18 = (byte)((int)uVar41 << 2);
        uVar52 = 0x9750468;
      }
      else {
        uVar41 = (uVar30 + 3) - (long)dist_cache[1];
        if (6 < uVar41) {
          uVar41 = 2;
          if ((uVar30 != (long)dist_cache[2]) && (uVar41 = 3, uVar30 != (long)dist_cache[3]))
          goto LAB_0034fab5;
          goto LAB_0034fab9;
        }
        bVar18 = (byte)((int)uVar41 << 2);
        uVar52 = 0xfdb1ace;
      }
      uVar41 = (ulong)(uVar52 >> (bVar18 & 0x1f) & 0xf);
    }
  }
LAB_0034fab9:
  if ((uVar30 <= local_b8) && (uVar41 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)uVar30;
  }
LAB_0034fae6:
  uVar52 = (uint)uVar43;
  local_d0->insert_len_ = uVar52;
  local_d0->copy_len_ = iVar32 << 0x19 | (uint)uVar50;
  uVar31 = (ulong)(params->dist).num_direct_distance_codes;
  uVar34 = uVar31 + 0x10;
  uVar25 = 0;
  if (uVar34 <= uVar41) {
    uVar45 = (params->dist).distance_postfix_bits;
    bVar18 = (byte)uVar45;
    uVar31 = ((4L << (bVar18 & 0x3f)) + (uVar41 - uVar31)) - 0x10;
    uVar37 = 0x1f;
    uVar26 = (uint)uVar31;
    if (uVar26 != 0) {
      for (; uVar26 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
    uVar22 = (ulong)((uVar31 >> ((ulong)uVar37 & 0x3f) & 1) != 0);
    lVar48 = (ulong)uVar37 - (ulong)uVar45;
    uVar41 = (~(-1 << (bVar18 & 0x1f)) & uVar26) + uVar34 +
             (uVar22 + lVar48 * 2 + 0xfffe << (bVar18 & 0x3f)) | lVar48 * 0x400;
    uVar25 = (uint32_t)(uVar31 - (uVar22 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar18 & 0x3f));
  }
  local_d0->dist_prefix_ = (uint16_t)uVar41;
  local_d0->dist_extra_ = uVar25;
  if (5 < uVar43) {
    if (uVar43 < 0x82) {
      uVar52 = 0x1f;
      uVar45 = (uint)(uVar43 - 2);
      if (uVar45 != 0) {
        for (; uVar45 >> uVar52 == 0; uVar52 = uVar52 - 1) {
        }
      }
      uVar52 = (int)(uVar43 - 2 >> ((char)(uVar52 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar52 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar43 < 0x842) {
      uVar45 = 0x1f;
      if (uVar52 - 0x42 != 0) {
        for (; uVar52 - 0x42 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar52 = (uVar45 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar52 = 0x15;
      if (0x1841 < uVar43) {
        uVar52 = (uint)(ushort)(0x17 - (uVar43 < 0x5842));
      }
    }
  }
  uVar45 = iVar32 + (uint)uVar50;
  if (uVar45 < 10) {
    uVar37 = uVar45 - 2;
  }
  else if (uVar45 < 0x86) {
    uVar45 = uVar45 - 6;
    uVar37 = 0x1f;
    if (uVar45 != 0) {
      for (; uVar45 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar37 = (uVar45 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar37 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar37 = 0x17;
    if (uVar45 < 0x846) {
      uVar37 = 0x1f;
      if (uVar45 - 0x46 != 0) {
        for (; uVar45 - 0x46 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar37 = (uVar37 ^ 0xffe0) + 0x2c;
    }
  }
  uVar42 = (ushort)uVar37;
  uVar14 = (uVar42 & 7) + ((ushort)uVar52 & 7) * 8;
  if ((((uVar41 & 0x3ff) == 0) && ((ushort)uVar52 < 8)) && (uVar42 < 0x10)) {
    if (7 < uVar42) {
      uVar14 = uVar14 + 0x40;
    }
  }
  else {
    iVar24 = ((uVar52 & 0xffff) >> 3) * 3 + ((uVar37 & 0xffff) >> 3);
    uVar14 = uVar14 + ((ushort)(0x520d40 >> ((char)iVar24 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar24 * 0x40 + 0x40;
  }
  local_d0->cmd_prefix_ = uVar14;
  *num_literals = *num_literals + uVar43;
  position = uVar50 + uVar36;
  uVar34 = sVar27;
  if (position < sVar27) {
    uVar34 = position;
  }
  uVar31 = uVar36 + 2;
  if (uVar30 < uVar50 >> 2) {
    uVar41 = position + uVar30 * -4;
    if (uVar41 < uVar31) {
      uVar41 = uVar31;
    }
    uVar31 = uVar41;
    if (uVar34 < uVar41) {
      uVar31 = uVar34;
    }
  }
  uVar41 = uVar36 + lVar28 + uVar50 * 2;
  local_d0 = local_d0 + 1;
  for (; uVar31 < uVar34; uVar31 = uVar31 + 1) {
    pvVar8 = (hasher->privat)._H40.extra[0];
    pvVar9 = (hasher->privat)._H40.extra[1];
    uVar52 = (uint)(*(int *)(ringbuffer + (uVar31 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar36 = (ulong)uVar52;
    uVar42 = (hasher->privat)._H42.free_slot_idx[0];
    (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
    uVar43 = uVar31 - *(uint *)((long)pvVar8 + uVar36 * 4);
    *(char *)((long)pvVar8 + (uVar31 & 0xffff) + 0x30000) = (char)uVar52;
    if (0xfffe < uVar43) {
      uVar43 = 0xffff;
    }
    *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar43;
    *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
         *(undefined2 *)((long)pvVar8 + uVar36 * 2 + 0x20000);
    *(int *)((long)pvVar8 + uVar36 * 4) = (int)uVar31;
    *(ushort *)((long)pvVar8 + uVar36 * 2 + 0x20000) = uVar42;
  }
  uVar34 = 0;
  goto LAB_0034ec3f;
code_r0x0034f6b9:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  uVar17 = uVar17 - 8;
  lVar48 = lVar48 + -8;
  goto LAB_0034f6a7;
code_r0x0034f552:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  uVar19 = uVar19 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_0034f540;
code_r0x0034f104:
  puVar20 = puVar20 + 1;
  puVar33 = puVar33 + 1;
  uVar40 = uVar40 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_0034f0f2;
code_r0x0034ef1c:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  uVar17 = uVar17 - 8;
  lVar48 = lVar48 + -8;
  goto LAB_0034ef0b;
code_r0x0034edc0:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  uVar19 = uVar19 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_0034edaf;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}